

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

void __thiscall
CDefineTableEntry::CDefineTableEntry
          (CDefineTableEntry *this,char *nname,char *nvalue,CStringsList *nnss,
          CDefineTableEntry *nnext)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  char *local_38;
  char *s1;
  CDefineTableEntry *nnext_local;
  CStringsList *nnss_local;
  char *nvalue_local;
  char *nname_local;
  CDefineTableEntry *this_local;
  
  this->name = (char *)0x0;
  this->value = (char *)0x0;
  pcVar1 = strdup(nname);
  this->name = pcVar1;
  sVar2 = strlen(nvalue);
  pcVar1 = (char *)operator_new__(sVar2 + 1);
  this->value = pcVar1;
  if ((this->name == (char *)0x0) || (this->value == (char *)0x0)) {
    ErrorOOM();
  }
  local_38 = this->value;
  nnss_local = (CStringsList *)nvalue;
  while( true ) {
    bVar3 = false;
    if ((*(char *)&nnss_local->string != '\0') &&
       (bVar3 = false, *(char *)&nnss_local->string != '\n')) {
      bVar3 = *(char *)&nnss_local->string != '\r';
    }
    if (!bVar3) break;
    *local_38 = *(char *)&nnss_local->string;
    local_38 = local_38 + 1;
    nnss_local = (CStringsList *)((long)&nnss_local->string + 1);
  }
  *local_38 = '\0';
  this->next = nnext;
  this->nss = nnss;
  return;
}

Assistant:

CDefineTableEntry::CDefineTableEntry(const char* nname, const char* nvalue, CStringsList* nnss, CDefineTableEntry* nnext)
		: name(NULL), value(NULL) {
	name = STRDUP(nname);
	value = new char[strlen(nvalue) + 1];
	if (NULL == name || NULL == value) ErrorOOM();
	char* s1 = value;
	while (*nvalue && *nvalue != '\n' && *nvalue != '\r') *s1++ = *nvalue++;
	*s1 = 0;
	next = nnext;
	nss = nnss;
}